

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void Rml::Parse::Relational(DataParser *parser)

{
  byte bVar1;
  bool bVar2;
  Instruction IVar3;
  bool bVar4;
  Variant VStack_48;
  
  Additive(parser);
  bVar4 = true;
  do {
    if (parser->reached_end == false) {
      bVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    }
    else {
      bVar1 = 0;
    }
    bVar2 = false;
    if (bVar1 < 0x3d) {
      if (bVar1 == 0x21) {
        DataParser::Match(parser,'!',false);
        DataParser::Match(parser,'=',true);
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,NotEqual,&VStack_48);
        goto LAB_001f39e7;
      }
      if (bVar1 == 0x3c) {
        DataParser::Match(parser,'<',false);
        if ((parser->reached_end == false) &&
           ((parser->expression)._M_dataplus._M_p[parser->index] == '=')) {
          DataParser::Match(parser,'=',true);
          IVar3 = LessEq;
        }
        else {
          DataParser::SkipWhitespace(parser);
          IVar3 = Less;
        }
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,IVar3,&VStack_48);
        goto LAB_001f39e7;
      }
    }
    else {
      if (bVar1 == 0x3e) {
        DataParser::Match(parser,'>',false);
        if ((parser->reached_end == false) &&
           ((parser->expression)._M_dataplus._M_p[parser->index] == '=')) {
          DataParser::Match(parser,'=',true);
          IVar3 = GreaterEq;
        }
        else {
          DataParser::SkipWhitespace(parser);
          IVar3 = Greater;
        }
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,IVar3,&VStack_48);
      }
      else {
        if (bVar1 != 0x3d) goto LAB_001f39f2;
        DataParser::Match(parser,'=',false);
        DataParser::Match(parser,'=',true);
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,Equal,&VStack_48);
      }
LAB_001f39e7:
      Variant::~Variant(&VStack_48);
      bVar2 = bVar4;
    }
LAB_001f39f2:
    bVar4 = bVar2;
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void Relational(DataParser& parser)
	{
		Additive(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '=': Equal(parser); break;
			case '!': NotEqual(parser); break;
			case '<': Less(parser); break;
			case '>': Greater(parser); break;
			default: looping = false;
			}
		}
	}